

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_assert.cpp
# Opt level: O1

int CloseTestEngine(bool force_report)

{
  return (int)(testing_fails != 0);
}

Assistant:

int CloseTestEngine(bool force_report)
  {
  if (!testing_fails || force_report)
    {

#if defined(MEMORY_LEAK_TRACKING_MSVC)
    auto flags = _CrtSetDbgFlag(_CRTDBG_REPORT_FLAG);
    flags &= ~_CRTDBG_DELAY_FREE_MEM_DF;
    flags |= _CRTDBG_LEAK_CHECK_DF;
    _CrtSetDbgFlag(flags);
#endif

    }

  return (0 != testing_fails);
  }